

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O3

void __thiscall MDDOpts::parse_arg(MDDOpts *this,string *arg)

{
  int iVar1;
  
  iVar1 = std::__cxx11::string::compare((char *)arg);
  if (iVar1 == 0) {
    this->expl_alg = E_MINIMAL;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)arg);
    if (iVar1 == 0) {
      this->expl_alg = E_GREEDY;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)arg);
      if (iVar1 == 0) {
        this->expl_strat = E_TEMP;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)arg);
        if (iVar1 == 0) {
          this->expl_strat = E_KEEP;
        }
      }
    }
  }
  return;
}

Assistant:

void parse_arg(const std::string& arg) {
		if (arg == "explain_minimal") {
			expl_alg = E_MINIMAL;
		} else if (arg == "explain_greedy") {
			expl_alg = E_GREEDY;
		} else if (arg == "discard_explanations") {
			expl_strat = E_TEMP;
		} else if (arg == "store_explanations") {
			expl_strat = E_KEEP;
		}
	}